

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DockBuilderCopyDockSpace
               (ImGuiID src_dockspace_id,ImGuiID dst_dockspace_id,
               ImVector<const_char_*> *in_window_remap_pairs)

{
  char *dst_name;
  undefined8 *puVar1;
  ImU32 key;
  ImGuiID IVar2;
  int *piVar3;
  void *pvVar4;
  ImGuiWindowSettings *pIVar5;
  int iVar6;
  char *pcVar7;
  int iVar8;
  ImGuiID node_id;
  long lVar9;
  int *piVar10;
  ulong uVar11;
  ImVector<unsigned_int> src_windows;
  ImVector<unsigned_int> node_remap_pairs;
  int local_58;
  int iStack_54;
  int *piStack_50;
  ImVector<unsigned_int> local_48;
  ImVector<const_char_*> *local_38;
  
  if (src_dockspace_id == 0) {
    __assert_fail("src_dockspace_id != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui.cpp"
                  ,0x3a0e,
                  "void ImGui::DockBuilderCopyDockSpace(ImGuiID, ImGuiID, ImVector<const char *> *)"
                 );
  }
  if (dst_dockspace_id == 0) {
    __assert_fail("dst_dockspace_id != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui.cpp"
                  ,0x3a0f,
                  "void ImGui::DockBuilderCopyDockSpace(ImGuiID, ImGuiID, ImVector<const char *> *)"
                 );
  }
  if (in_window_remap_pairs == (ImVector<const_char_*> *)0x0) {
    __assert_fail("in_window_remap_pairs != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui.cpp"
                  ,0x3a10,
                  "void ImGui::DockBuilderCopyDockSpace(ImGuiID, ImGuiID, ImVector<const char *> *)"
                 );
  }
  if ((in_window_remap_pairs->Size & 1) != 0) {
    __assert_fail("(in_window_remap_pairs->Size % 2) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui.cpp"
                  ,0x3a11,
                  "void ImGui::DockBuilderCopyDockSpace(ImGuiID, ImGuiID, ImVector<const char *> *)"
                 );
  }
  local_48.Size = 0;
  local_48.Capacity = 0;
  local_48.Data = (uint *)0x0;
  DockBuilderCopyNode(src_dockspace_id,dst_dockspace_id,&local_48);
  local_58 = 0;
  iStack_54 = 0;
  piStack_50 = (int *)0x0;
  iVar6 = in_window_remap_pairs->Size;
  if (0 < iVar6) {
    uVar11 = 0;
    local_38 = in_window_remap_pairs;
    do {
      if ((long)iVar6 <= (long)(uVar11 | 1)) {
        pcVar7 = "T &ImVector<const char *>::operator[](int) [T = const char *]";
        goto LAB_002f2c63;
      }
      pcVar7 = in_window_remap_pairs->Data[uVar11];
      dst_name = in_window_remap_pairs->Data[uVar11 | 1];
      key = ImHashStr(pcVar7,0,0);
      piVar3 = piStack_50;
      if (local_58 == iStack_54) {
        if (iStack_54 == 0) {
          iVar6 = 8;
        }
        else {
          iVar6 = iStack_54 / 2 + iStack_54;
        }
        iVar8 = local_58 + 1;
        if (local_58 + 1 < iVar6) {
          iVar8 = iVar6;
        }
        if (iStack_54 < iVar8) {
          if (GImGui != (ImGuiContext *)0x0) {
            piVar3 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar3 = *piVar3 + 1;
          }
          piVar3 = (int *)(*GImAllocatorAllocFunc)((long)iVar8 << 2,GImAllocatorUserData);
          in_window_remap_pairs = local_38;
          iStack_54 = iVar8;
          if (piStack_50 != (int *)0x0) {
            memcpy(piVar3,piStack_50,(long)local_58 << 2);
            if ((piStack_50 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
              piVar10 = &(GImGui->IO).MetricsActiveAllocations;
              *piVar10 = *piVar10 + -1;
            }
            (*GImAllocatorFreeFunc)(piStack_50,GImAllocatorUserData);
            in_window_remap_pairs = local_38;
          }
        }
      }
      piStack_50 = piVar3;
      piStack_50[local_58] = key;
      local_58 = local_58 + 1;
      pvVar4 = ImGuiStorage::GetVoidPtr(&GImGui->WindowsById,key);
      if (pvVar4 == (void *)0x0) {
        pIVar5 = FindWindowSettings(key);
        if (pIVar5 == (ImGuiWindowSettings *)0x0) {
          IVar2 = 0;
        }
        else {
          IVar2 = pIVar5->DockId;
        }
      }
      else {
        IVar2 = *(ImGuiID *)((long)pvVar4 + 0x438);
      }
      node_id = 0;
      if (0 < local_48.Size) {
        lVar9 = 0;
        do {
          if (local_48.Data[lVar9] == IVar2) {
            if (local_48.Size <= (int)(lVar9 + 1U)) goto LAB_002f2c4e;
            node_id = local_48.Data[lVar9 + 1U & 0xffffffff];
            break;
          }
          lVar9 = lVar9 + 2;
        } while ((int)lVar9 < local_48.Size);
      }
      if (node_id == 0) {
        DockBuilderCopyWindowSettings(pcVar7,dst_name);
      }
      else {
        DockBuilderDockWindow(dst_name,node_id);
      }
      uVar11 = uVar11 + 2;
      iVar6 = in_window_remap_pairs->Size;
    } while ((int)uVar11 < iVar6);
  }
  if (0 < local_48.Size) {
    uVar11 = 0;
    do {
      if (local_48.Data[uVar11] != 0) {
        if ((long)local_48.Size <= (long)(uVar11 | 1)) {
LAB_002f2c4e:
          pcVar7 = "T &ImVector<unsigned int>::operator[](int) [T = unsigned int]";
LAB_002f2c63:
          __assert_fail("i >= 0 && i < Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui.h"
                        ,0x688,pcVar7);
        }
        IVar2 = local_48.Data[uVar11 | 1];
        pvVar4 = ImGuiStorage::GetVoidPtr(&(GImGui->DockContext).Nodes,local_48.Data[uVar11]);
        if (0 < *(int *)((long)pvVar4 + 0x28)) {
          lVar9 = 0;
          do {
            puVar1 = *(undefined8 **)(*(long *)((long)pvVar4 + 0x30) + lVar9 * 8);
            piVar3 = piStack_50;
            do {
              piVar10 = piVar3;
              if (piStack_50 + local_58 <= piVar10) goto LAB_002f2ba9;
              piVar3 = piVar10 + 1;
            } while (*piVar10 != *(int *)(puVar1 + 1));
            if (piStack_50 + local_58 <= piVar10) {
LAB_002f2ba9:
              DockBuilderDockWindow((char *)*puVar1,IVar2);
            }
            lVar9 = lVar9 + 1;
          } while (lVar9 < *(int *)((long)pvVar4 + 0x28));
        }
      }
      uVar11 = uVar11 + 2;
    } while ((int)uVar11 < local_48.Size);
  }
  if (piStack_50 != (int *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar3 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar3 = *piVar3 + -1;
    }
    (*GImAllocatorFreeFunc)(piStack_50,GImAllocatorUserData);
  }
  if (local_48.Data != (uint *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar3 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar3 = *piVar3 + -1;
    }
    (*GImAllocatorFreeFunc)(local_48.Data,GImAllocatorUserData);
  }
  return;
}

Assistant:

void ImGui::DockBuilderCopyDockSpace(ImGuiID src_dockspace_id, ImGuiID dst_dockspace_id, ImVector<const char*>* in_window_remap_pairs)
{
    IM_ASSERT(src_dockspace_id != 0);
    IM_ASSERT(dst_dockspace_id != 0);
    IM_ASSERT(in_window_remap_pairs != NULL);
    IM_ASSERT((in_window_remap_pairs->Size % 2) == 0);

    // Duplicate entire dock
    // FIXME: When overwriting dst_dockspace_id, windows that aren't part of our dockspace window class but that are docked in a same node will be split apart,
    // whereas we could attempt to at least keep them together in a new, same floating node.
    ImVector<ImGuiID> node_remap_pairs;
    DockBuilderCopyNode(src_dockspace_id, dst_dockspace_id, &node_remap_pairs);

    // Attempt to transition all the upcoming windows associated to dst_dockspace_id into the newly created hierarchy of dock nodes
    // (The windows associated to src_dockspace_id are staying in place)
    ImVector<ImGuiID> src_windows;
    for (int remap_window_n = 0; remap_window_n < in_window_remap_pairs->Size; remap_window_n += 2)
    {
        const char* src_window_name = (*in_window_remap_pairs)[remap_window_n];
        const char* dst_window_name = (*in_window_remap_pairs)[remap_window_n + 1];
        ImGuiID src_window_id = ImHashStr(src_window_name);
        src_windows.push_back(src_window_id);

        // Search in the remapping tables
        ImGuiID src_dock_id = 0;
        if (ImGuiWindow* src_window = FindWindowByID(src_window_id))
            src_dock_id = src_window->DockId;
        else if (ImGuiWindowSettings* src_window_settings = FindWindowSettings(src_window_id))
            src_dock_id = src_window_settings->DockId;
        ImGuiID dst_dock_id = 0;
        for (int dock_remap_n = 0; dock_remap_n < node_remap_pairs.Size; dock_remap_n += 2)
            if (node_remap_pairs[dock_remap_n] == src_dock_id)
            {
                dst_dock_id = node_remap_pairs[dock_remap_n + 1];
                //node_remap_pairs[dock_remap_n] = node_remap_pairs[dock_remap_n + 1] = 0; // Clear
                break;
            }

        if (dst_dock_id != 0)
        {
            // Docked windows gets redocked into the new node hierarchy.
            IMGUI_DEBUG_LOG_DOCKING("Remap live window '%s' 0x%08X -> '%s' 0x%08X\n", src_window_name, src_dock_id, dst_window_name, dst_dock_id);
            DockBuilderDockWindow(dst_window_name, dst_dock_id);
        }
        else
        {
            // Floating windows gets their settings transferred (regardless of whether the new window already exist or not)
            // When this is leading to a Copy and not a Move, we would get two overlapping floating windows. Could we possibly dock them together?
            IMGUI_DEBUG_LOG_DOCKING("Remap window settings '%s' -> '%s'\n", src_window_name, dst_window_name);
            DockBuilderCopyWindowSettings(src_window_name, dst_window_name);
        }
    }

    // Anything else in the source nodes of 'node_remap_pairs' are windows that were docked in src_dockspace_id but are not owned by it (unaffiliated windows, e.g. "ImGui Demo")
    // Find those windows and move to them to the cloned dock node. This may be optional?
    for (int dock_remap_n = 0; dock_remap_n < node_remap_pairs.Size; dock_remap_n += 2)
        if (ImGuiID src_dock_id = node_remap_pairs[dock_remap_n])
        {
            ImGuiID dst_dock_id = node_remap_pairs[dock_remap_n + 1];
            ImGuiDockNode* node = DockBuilderGetNode(src_dock_id);
            for (int window_n = 0; window_n < node->Windows.Size; window_n++)
            {
                ImGuiWindow* window = node->Windows[window_n];
                if (src_windows.contains(window->ID))
                    continue;

                // Docked windows gets redocked into the new node hierarchy.
                IMGUI_DEBUG_LOG_DOCKING("Remap window '%s' %08X -> %08X\n", window->Name, src_dock_id, dst_dock_id);
                DockBuilderDockWindow(window->Name, dst_dock_id);
            }
        }
}